

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_read_blocks(lzx_stream *strm,wchar_t last)

{
  uchar uVar1;
  byte bVar2;
  wchar_t wVar3;
  lzx_dec *plVar4;
  uchar *puVar5;
  wchar_t wVar6;
  lzx_br *br_00;
  int local_40;
  wchar_t l;
  wchar_t wStack_34;
  uint16_t u16;
  wchar_t r;
  wchar_t i;
  lzx_br *br;
  lzx_dec *ds;
  wchar_t last_local;
  lzx_stream *strm_local;
  
  plVar4 = strm->ds;
  br_00 = &plVar4->br;
switchD_009353ed_default:
  switch(plVar4->state) {
  case L'\0':
    if ((((plVar4->br).cache_avail < L'\x01') && (wVar6 = lzx_br_fillup(strm,br_00), wVar6 == L'\0')
        ) && ((plVar4->br).cache_avail < L'\x01')) {
      plVar4->state = L'\0';
      if (last == L'\0') {
        return L'\0';
      }
      break;
    }
    plVar4->translation =
         (byte)(br_00->cache_buffer >> ((char)(plVar4->br).cache_avail - 1U & 0x3f)) & 1;
    (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xffffffff';
  case L'\x01':
    if (plVar4->translation != '\0') {
      if ((((plVar4->br).cache_avail < L' ') && (wVar6 = lzx_br_fillup(strm,br_00), wVar6 == L'\0'))
         && ((plVar4->br).cache_avail < L' ')) {
        plVar4->state = L'\x01';
        if (last == L'\0') {
          return L'\0';
        }
        break;
      }
      plVar4->translation_size =
           (uint)(br_00->cache_buffer >> ((char)(plVar4->br).cache_avail - 0x10U & 0x3f)) & 0xffff;
      (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffff0';
      plVar4->translation_size = plVar4->translation_size << 0x10;
      plVar4->translation_size =
           (uint)(br_00->cache_buffer >> ((char)(plVar4->br).cache_avail - 0x10U & 0x3f)) & 0xffff |
           plVar4->translation_size;
      (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffff0';
    }
switchD_009353ed_caseD_2:
    if ((((plVar4->br).cache_avail < L'\x03') && (wVar6 = lzx_br_fillup(strm,br_00), wVar6 == L'\0')
        ) && ((plVar4->br).cache_avail < L'\x03')) {
      plVar4->state = L'\x02';
      if (last == L'\0') {
        return L'\0';
      }
      break;
    }
    plVar4->block_type =
         (byte)(br_00->cache_buffer >> ((char)(plVar4->br).cache_avail - 3U & 0x3f)) & 7;
    (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffffd';
    if (2 < (int)plVar4->block_type - 1U) break;
switchD_009353ed_caseD_3:
    if ((((plVar4->br).cache_avail < L'\x18') && (wVar6 = lzx_br_fillup(strm,br_00), wVar6 == L'\0')
        ) && ((plVar4->br).cache_avail < L'\x18')) {
      plVar4->state = L'\x03';
      if (last == L'\0') {
        return L'\0';
      }
      break;
    }
    plVar4->block_size =
         (ulong)((uint)(br_00->cache_buffer >> ((char)(plVar4->br).cache_avail - 8U & 0x3f)) & 0xff)
    ;
    (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffff8';
    plVar4->block_size = plVar4->block_size << 0x10;
    plVar4->block_size =
         (ulong)((uint)(br_00->cache_buffer >> ((char)(plVar4->br).cache_avail - 0x10U & 0x3f)) &
                0xffff) | plVar4->block_size;
    (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffff0';
    if (plVar4->block_size == 0) break;
    plVar4->block_bytes_avail = plVar4->block_size;
    if (plVar4->block_type == '\x03') goto switchD_009353ed_caseD_4;
    if (plVar4->block_type == '\x01') {
      plVar4->state = L'\v';
    }
    else {
      plVar4->state = L'\n';
    }
    goto switchD_009353ed_default;
  case L'\x02':
    goto switchD_009353ed_caseD_2;
  case L'\x03':
    goto switchD_009353ed_caseD_3;
  case L'\x04':
    goto switchD_009353ed_caseD_4;
  case L'\x05':
  case L'\x06':
  case L'\a':
    goto switchD_009353ed_caseD_5;
  case L'\b':
    goto switchD_009353ed_caseD_8;
  case L'\t':
    goto switchD_009353ed_caseD_9;
  case L'\n':
    wVar6 = (plVar4->br).cache_avail;
    wVar3 = (plVar4->at).len_size;
    if (((SBORROW4(wVar6,wVar3 * 3) != wVar6 + wVar3 * -3 < 0) &&
        (wVar6 = lzx_br_fillup(strm,br_00), wVar6 == L'\0')) &&
       (wVar6 = (plVar4->br).cache_avail, wVar3 = (plVar4->at).len_size,
       SBORROW4(wVar6,wVar3 * 3) != wVar6 + wVar3 * -3 < 0)) {
      plVar4->state = L'\n';
      if (last == L'\0') {
        return L'\0';
      }
      break;
    }
    memset((plVar4->at).freq,0,0x44);
    for (wStack_34 = L'\0'; wStack_34 < (plVar4->at).len_size; wStack_34 = wStack_34 + L'\x01') {
      (plVar4->at).bitlen[wStack_34] =
           (byte)(br_00->cache_buffer >> ((char)(plVar4->br).cache_avail - 3U & 0x3f)) & 7;
      bVar2 = (plVar4->at).bitlen[wStack_34];
      (plVar4->at).freq[bVar2] = (plVar4->at).freq[bVar2] + L'\x01';
      (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffffd';
    }
    wVar6 = lzx_make_huffman_table(&plVar4->at);
    if (wVar6 == L'\0') break;
switchD_009353ed_caseD_b:
    plVar4->loop = L'\0';
switchD_009353ed_caseD_c:
    wVar6 = lzx_read_pre_tree(strm);
    if (wVar6 == L'\0') {
      plVar4->state = L'\f';
      if (last == L'\0') {
        return L'\0';
      }
    }
    else {
      wVar6 = lzx_make_huffman_table(&plVar4->pt);
      if (wVar6 != L'\0') {
        plVar4->loop = L'\0';
switchD_009353ed_caseD_d:
        wVar6 = lzx_read_bitlen(strm,&plVar4->mt,L'Ā');
        if (L'\xffffffff' < wVar6) {
          if (wVar6 == L'\0') {
            plVar4->state = L'\r';
            if (last == L'\0') {
              return L'\0';
            }
          }
          else {
            plVar4->loop = L'\0';
switchD_009353ed_caseD_e:
            wVar6 = lzx_read_pre_tree(strm);
            if (wVar6 == L'\0') {
              plVar4->state = L'\x0e';
              if (last == L'\0') {
                return L'\0';
              }
            }
            else {
              wVar6 = lzx_make_huffman_table(&plVar4->pt);
              if (wVar6 != L'\0') {
                plVar4->loop = L'Ā';
switchD_009353ed_caseD_f:
                wVar6 = lzx_read_bitlen(strm,&plVar4->mt,L'\xffffffff');
                if (L'\xffffffff' < wVar6) {
                  if (wVar6 == L'\0') {
                    plVar4->state = L'\x0f';
                    if (last == L'\0') {
                      return L'\0';
                    }
                  }
                  else {
                    wVar6 = lzx_make_huffman_table(&plVar4->mt);
                    if (wVar6 != L'\0') {
                      plVar4->loop = L'\0';
switchD_009353ed_caseD_10:
                      wVar6 = lzx_read_pre_tree(strm);
                      if (wVar6 == L'\0') {
                        plVar4->state = L'\x10';
                        if (last == L'\0') {
                          return L'\0';
                        }
                      }
                      else {
                        wVar6 = lzx_make_huffman_table(&plVar4->pt);
                        if (wVar6 != L'\0') {
                          plVar4->loop = L'\0';
switchD_009353ed_caseD_11:
                          wVar6 = lzx_read_bitlen(strm,&plVar4->lt,L'\xffffffff');
                          if (L'\xffffffff' < wVar6) {
                            if (wVar6 == L'\0') {
                              plVar4->state = L'\x11';
                              if (last == L'\0') {
                                return L'\0';
                              }
                            }
                            else {
                              wVar6 = lzx_make_huffman_table(&plVar4->lt);
                              if (wVar6 != L'\0') {
                                plVar4->state = L'\x12';
                                return L'd';
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case L'\v':
    goto switchD_009353ed_caseD_b;
  case L'\f':
    goto switchD_009353ed_caseD_c;
  case L'\r':
    goto switchD_009353ed_caseD_d;
  case L'\x0e':
    goto switchD_009353ed_caseD_e;
  case L'\x0f':
    goto switchD_009353ed_caseD_f;
  case L'\x10':
    goto switchD_009353ed_caseD_10;
  case L'\x11':
    goto switchD_009353ed_caseD_11;
  default:
    goto switchD_009353ed_default;
  }
LAB_00935f24:
  plVar4->error = L'\xffffffe7';
  return L'\xffffffe7';
switchD_009353ed_caseD_4:
  if (((plVar4->br).cache_avail & 0xfU) == 0) {
    if ((((plVar4->br).cache_avail < L'\x10') && (wVar6 = lzx_br_fillup(strm,br_00), wVar6 == L'\0')
        ) && ((plVar4->br).cache_avail < L'\x10')) {
      plVar4->state = L'\x04';
      if (last == L'\0') {
        return L'\0';
      }
      goto LAB_00935f24;
    }
    (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffff0';
  }
  else {
    (plVar4->br).cache_avail = (plVar4->br).cache_avail & 0xfffffff0;
  }
  plVar4->rbytes_avail = L'\0';
  plVar4->state = L'\x05';
switchD_009353ed_caseD_5:
  do {
    if ((plVar4->br).cache_avail < L' ') {
      if (L'\x0f' < (plVar4->br).cache_avail) {
        wVar6 = (plVar4->br).cache_avail;
        (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffff0';
        archive_le16enc(plVar4->rbytes,
                        (uint16_t)(br_00->cache_buffer >> ((char)wVar6 - 0x10U & 0x3f)));
        plVar4->rbytes_avail = L'\x02';
      }
    }
    else {
      wVar6 = (plVar4->br).cache_avail;
      (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffff0';
      archive_le16enc(plVar4->rbytes,(uint16_t)(br_00->cache_buffer >> ((char)wVar6 - 0x10U & 0x3f))
                     );
      wVar6 = (plVar4->br).cache_avail;
      (plVar4->br).cache_avail = (plVar4->br).cache_avail + L'\xfffffff0';
      archive_le16enc(plVar4->rbytes + 2,
                      (uint16_t)(br_00->cache_buffer >> ((char)wVar6 - 0x10U & 0x3f)));
      plVar4->rbytes_avail = L'\x04';
    }
    if ((plVar4->rbytes_avail < L'\x04') && ((plVar4->br).have_odd != '\0')) {
      uVar1 = (plVar4->br).odd;
      wVar6 = plVar4->rbytes_avail;
      plVar4->rbytes_avail = wVar6 + L'\x01';
      plVar4->rbytes[wVar6] = uVar1;
      (plVar4->br).have_odd = '\0';
    }
    while (plVar4->rbytes_avail < L'\x04') {
      if (strm->avail_in < 1) {
        if (last == L'\0') {
          return L'\0';
        }
        goto LAB_00935f24;
      }
      puVar5 = strm->next_in;
      strm->next_in = puVar5 + 1;
      uVar1 = *puVar5;
      wVar6 = plVar4->rbytes_avail;
      plVar4->rbytes_avail = wVar6 + L'\x01';
      plVar4->rbytes[wVar6] = uVar1;
      strm->avail_in = strm->avail_in + -1;
    }
    plVar4->rbytes_avail = L'\0';
    if (plVar4->state == L'\x05') {
      wVar6 = archive_le32dec(plVar4->rbytes);
      plVar4->r0 = wVar6;
      if (plVar4->r0 < L'\0') goto LAB_00935f24;
      plVar4->state = L'\x06';
    }
    else if (plVar4->state == L'\x06') {
      wVar6 = archive_le32dec(plVar4->rbytes);
      plVar4->r1 = wVar6;
      if (plVar4->r1 < L'\0') goto LAB_00935f24;
      plVar4->state = L'\a';
    }
    else if (plVar4->state == L'\a') {
      wVar6 = archive_le32dec(plVar4->rbytes);
      plVar4->r2 = wVar6;
      if (plVar4->r2 < L'\0') goto LAB_00935f24;
      plVar4->state = L'\b';
    }
  } while (plVar4->state != L'\b');
switchD_009353ed_caseD_8:
  while (plVar4->block_bytes_avail != 0) {
    if (strm->avail_out < 1) {
      return L'\0';
    }
    if (strm->avail_in < 1) {
      if (last == L'\0') {
        return L'\0';
      }
      goto LAB_00935f24;
    }
    local_40 = (int)plVar4->block_bytes_avail;
    if (plVar4->w_size - plVar4->w_pos < local_40) {
      local_40 = plVar4->w_size - plVar4->w_pos;
    }
    if (strm->avail_out < (long)local_40) {
      local_40 = (int)strm->avail_out;
    }
    if (strm->avail_in < (long)local_40) {
      local_40 = (int)strm->avail_in;
    }
    memcpy(strm->next_out,strm->next_in,(long)local_40);
    memcpy(plVar4->w_buff + plVar4->w_pos,strm->next_in,(long)local_40);
    strm->next_in = strm->next_in + local_40;
    strm->avail_in = strm->avail_in - (long)local_40;
    strm->next_out = strm->next_out + local_40;
    strm->avail_out = strm->avail_out - (long)local_40;
    strm->total_out = (long)local_40 + strm->total_out;
    plVar4->w_pos = plVar4->w_pos + local_40 & plVar4->w_mask;
    plVar4->block_bytes_avail = plVar4->block_bytes_avail - (long)local_40;
  }
switchD_009353ed_caseD_9:
  if ((plVar4->block_size & 1) != 0) {
    if (strm->avail_in < 1) {
      plVar4->state = L'\t';
      if (last == L'\0') {
        return L'\0';
      }
      goto LAB_00935f24;
    }
    strm->next_in = strm->next_in + 1;
    strm->avail_in = strm->avail_in + -1;
  }
  plVar4->state = L'\x02';
  return L'\x01';
}

Assistant:

static int
lzx_read_blocks(struct lzx_stream *strm, int last)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int i, r;

	for (;;) {
		switch (ds->state) {
		case ST_RD_TRANSLATION:
			if (!lzx_br_read_ahead(strm, br, 1)) {
				ds->state = ST_RD_TRANSLATION;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			ds->translation = lzx_br_bits(br, 1);
			lzx_br_consume(br, 1);
			/* FALL THROUGH */
		case ST_RD_TRANSLATION_SIZE:
			if (ds->translation) {
				if (!lzx_br_read_ahead(strm, br, 32)) {
					ds->state = ST_RD_TRANSLATION_SIZE;
					if (last)
						goto failed;
					return (ARCHIVE_OK);
				}
				ds->translation_size = lzx_br_bits(br, 16);
				lzx_br_consume(br, 16);
				ds->translation_size <<= 16;
				ds->translation_size |= lzx_br_bits(br, 16);
				lzx_br_consume(br, 16);
			}
			/* FALL THROUGH */
		case ST_RD_BLOCK_TYPE:
			if (!lzx_br_read_ahead(strm, br, 3)) {
				ds->state = ST_RD_BLOCK_TYPE;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			ds->block_type = lzx_br_bits(br, 3);
			lzx_br_consume(br, 3);
			/* Check a block type. */
			switch (ds->block_type) {
			case VERBATIM_BLOCK:
			case ALIGNED_OFFSET_BLOCK:
			case UNCOMPRESSED_BLOCK:
				break;
			default:
				goto failed;/* Invalid */
			}
			/* FALL THROUGH */
		case ST_RD_BLOCK_SIZE:
			if (!lzx_br_read_ahead(strm, br, 24)) {
				ds->state = ST_RD_BLOCK_SIZE;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			ds->block_size = lzx_br_bits(br, 8);
			lzx_br_consume(br, 8);
			ds->block_size <<= 16;
			ds->block_size |= lzx_br_bits(br, 16);
			lzx_br_consume(br, 16);
			if (ds->block_size == 0)
				goto failed;
			ds->block_bytes_avail = ds->block_size;
			if (ds->block_type != UNCOMPRESSED_BLOCK) {
				if (ds->block_type == VERBATIM_BLOCK)
					ds->state = ST_RD_VERBATIM;
				else
					ds->state = ST_RD_ALIGNED_OFFSET;
				break;
			}
			/* FALL THROUGH */
		case ST_RD_ALIGNMENT:
			/*
			 * Handle an Uncompressed Block.
			 */
			/* Skip padding to align following field on
			 * 16-bit boundary. */
			if (lzx_br_is_unaligned(br))
				lzx_br_consume_unaligned_bits(br);
			else {
				if (lzx_br_read_ahead(strm, br, 16))
					lzx_br_consume(br, 16);
				else {
					ds->state = ST_RD_ALIGNMENT;
					if (last)
						goto failed;
					return (ARCHIVE_OK);
				}
			}
			/* Preparation to read repeated offsets R0,R1 and R2. */
			ds->rbytes_avail = 0;
			ds->state = ST_RD_R0;
			/* FALL THROUGH */
		case ST_RD_R0:
		case ST_RD_R1:
		case ST_RD_R2:
			do {
				uint16_t u16;
				/* Drain bits in the cache buffer of
				 * bit-stream. */
				if (lzx_br_has(br, 32)) {
					u16 = lzx_br_bits(br, 16);
					lzx_br_consume(br, 16);
					archive_le16enc(ds->rbytes, u16);
					u16 = lzx_br_bits(br, 16);
					lzx_br_consume(br, 16);
					archive_le16enc(ds->rbytes+2, u16);
					ds->rbytes_avail = 4;
				} else if (lzx_br_has(br, 16)) {
					u16 = lzx_br_bits(br, 16);
					lzx_br_consume(br, 16);
					archive_le16enc(ds->rbytes, u16);
					ds->rbytes_avail = 2;
				}
				if (ds->rbytes_avail < 4 && ds->br.have_odd) {
					ds->rbytes[ds->rbytes_avail++] =
					    ds->br.odd;
					ds->br.have_odd = 0;
				}
				while (ds->rbytes_avail < 4) {
					if (strm->avail_in <= 0) {
						if (last)
							goto failed;
						return (ARCHIVE_OK);
					}
					ds->rbytes[ds->rbytes_avail++] =
					    *strm->next_in++;
					strm->avail_in--;
				}
				ds->rbytes_avail = 0;
				if (ds->state == ST_RD_R0) {
					ds->r0 = archive_le32dec(ds->rbytes);
					if (ds->r0 < 0)
						goto failed;
					ds->state = ST_RD_R1;
				} else if (ds->state == ST_RD_R1) {
					ds->r1 = archive_le32dec(ds->rbytes);
					if (ds->r1 < 0)
						goto failed;
					ds->state = ST_RD_R2;
				} else if (ds->state == ST_RD_R2) {
					ds->r2 = archive_le32dec(ds->rbytes);
					if (ds->r2 < 0)
						goto failed;
					/* We've gotten all repeated offsets. */
					ds->state = ST_COPY_UNCOMP1;
				}
			} while (ds->state != ST_COPY_UNCOMP1);
			/* FALL THROUGH */
		case ST_COPY_UNCOMP1:
			/*
			 * Copy bytes form next_in to next_out directly.
			 */
			while (ds->block_bytes_avail) {
				int l;

				if (strm->avail_out <= 0)
					/* Output buffer is empty. */
					return (ARCHIVE_OK);
				if (strm->avail_in <= 0) {
					/* Input buffer is empty. */
					if (last)
						goto failed;
					return (ARCHIVE_OK);
				}
				l = (int)ds->block_bytes_avail;
				if (l > ds->w_size - ds->w_pos)
					l = ds->w_size - ds->w_pos;
				if (l > strm->avail_out)
					l = (int)strm->avail_out;
				if (l > strm->avail_in)
					l = (int)strm->avail_in;
				memcpy(strm->next_out, strm->next_in, l);
				memcpy(&(ds->w_buff[ds->w_pos]),
				    strm->next_in, l);
				strm->next_in += l;
				strm->avail_in -= l;
				strm->next_out += l;
				strm->avail_out -= l;
				strm->total_out += l;
				ds->w_pos = (ds->w_pos + l) & ds->w_mask;
				ds->block_bytes_avail -= l;
			}
			/* FALL THROUGH */
		case ST_COPY_UNCOMP2:
			/* Re-align; skip padding byte. */
			if (ds->block_size & 1) {
				if (strm->avail_in <= 0) {
					/* Input buffer is empty. */
					ds->state = ST_COPY_UNCOMP2;
					if (last)
						goto failed;
					return (ARCHIVE_OK);
				}
				strm->next_in++;
				strm->avail_in --;
			}
			/* This block ended. */
			ds->state = ST_RD_BLOCK_TYPE;
			return (ARCHIVE_EOF);
			/********************/
		case ST_RD_ALIGNED_OFFSET:
			/*
			 * Read Aligned offset tree.
			 */
			if (!lzx_br_read_ahead(strm, br, 3 * ds->at.len_size)) {
				ds->state = ST_RD_ALIGNED_OFFSET;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			memset(ds->at.freq, 0, sizeof(ds->at.freq));
			for (i = 0; i < ds->at.len_size; i++) {
				ds->at.bitlen[i] = lzx_br_bits(br, 3);
				ds->at.freq[ds->at.bitlen[i]]++;
				lzx_br_consume(br, 3);
			}
			if (!lzx_make_huffman_table(&ds->at))
				goto failed;
			/* FALL THROUGH */
		case ST_RD_VERBATIM:
			ds->loop = 0;
			/* FALL THROUGH */
		case ST_RD_PRE_MAIN_TREE_256:
			/*
			 * Read Pre-tree for first 256 elements of main tree.
			 */
			if (!lzx_read_pre_tree(strm)) {
				ds->state = ST_RD_PRE_MAIN_TREE_256;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			if (!lzx_make_huffman_table(&ds->pt))
				goto failed;
			ds->loop = 0;
			/* FALL THROUGH */
		case ST_MAIN_TREE_256:
			/*
			 * Get path lengths of first 256 elements of main tree.
			 */
			r = lzx_read_bitlen(strm, &ds->mt, 256);
			if (r < 0)
				goto failed;
			else if (!r) {
				ds->state = ST_MAIN_TREE_256;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			ds->loop = 0;
			/* FALL THROUGH */
		case ST_RD_PRE_MAIN_TREE_REM:
			/*
			 * Read Pre-tree for remaining elements of main tree.
			 */
			if (!lzx_read_pre_tree(strm)) {
				ds->state = ST_RD_PRE_MAIN_TREE_REM;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			if (!lzx_make_huffman_table(&ds->pt))
				goto failed;
			ds->loop = 256;
			/* FALL THROUGH */
		case ST_MAIN_TREE_REM:
			/*
			 * Get path lengths of remaining elements of main tree.
			 */
			r = lzx_read_bitlen(strm, &ds->mt, -1);
			if (r < 0)
				goto failed;
			else if (!r) {
				ds->state = ST_MAIN_TREE_REM;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			if (!lzx_make_huffman_table(&ds->mt))
				goto failed;
			ds->loop = 0;
			/* FALL THROUGH */
		case ST_RD_PRE_LENGTH_TREE:
			/*
			 * Read Pre-tree for remaining elements of main tree.
			 */
			if (!lzx_read_pre_tree(strm)) {
				ds->state = ST_RD_PRE_LENGTH_TREE;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			if (!lzx_make_huffman_table(&ds->pt))
				goto failed;
			ds->loop = 0;
			/* FALL THROUGH */
		case ST_LENGTH_TREE:
			/*
			 * Get path lengths of remaining elements of main tree.
			 */
			r = lzx_read_bitlen(strm, &ds->lt, -1);
			if (r < 0)
				goto failed;
			else if (!r) {
				ds->state = ST_LENGTH_TREE;
				if (last)
					goto failed;
				return (ARCHIVE_OK);
			}
			if (!lzx_make_huffman_table(&ds->lt))
				goto failed;
			ds->state = ST_MAIN;
			return (100);
		}
	}
failed:
	return (ds->error = ARCHIVE_FAILED);
}